

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

int Acb_NtkCollectMfsGates
              (char *pFileName,Vec_Ptr_t *vNamesRefed,Vec_Ptr_t *vNamesDerefed,int *nGates)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  Acb_Ntk_t *pNtk;
  Vec_Int_t *vNamesInv;
  Vec_Int_t *vObjsRefed;
  Vec_Int_t *vObjsDerefed;
  Vec_Int_t *__ptr;
  ulong uVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = 0;
  pNtk = Acb_VerilogSimpleRead(pFileName,(char *)0x0);
  vNamesInv = Vec_IntInvert(&pNtk->vObjName,iVar5);
  vObjsRefed = Acb_NamesToIds(pNtk,vNamesInv,vNamesRefed);
  vObjsDerefed = Acb_NamesToIds(pNtk,vNamesInv,vNamesDerefed);
  __ptr = Acb_NtkCollectMffc(pNtk,vObjsRefed,vObjsDerefed);
  uVar1 = __ptr->nSize;
  if (vNamesInv->pArray != (int *)0x0) {
    free(vNamesInv->pArray);
    vNamesInv->pArray = (int *)0x0;
  }
  if (vNamesInv != (Vec_Int_t *)0x0) {
    free(vNamesInv);
  }
  if (vObjsRefed->pArray != (int *)0x0) {
    free(vObjsRefed->pArray);
    vObjsRefed->pArray = (int *)0x0;
  }
  if (vObjsRefed != (Vec_Int_t *)0x0) {
    free(vObjsRefed);
  }
  if (vObjsDerefed->pArray != (int *)0x0) {
    free(vObjsDerefed->pArray);
    vObjsDerefed->pArray = (int *)0x0;
  }
  if (vObjsDerefed != (Vec_Int_t *)0x0) {
    free(vObjsDerefed);
  }
  nGates[0] = 0;
  nGates[1] = 0;
  nGates[2] = 0;
  nGates[3] = 0;
  nGates[4] = 0;
  if (0 < (int)uVar1) {
    piVar3 = __ptr->pArray;
    uVar4 = 0;
    do {
      iVar5 = piVar3[uVar4];
      lVar6 = (long)iVar5;
      if (lVar6 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((pNtk->vObjFans).nSize <= iVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (pNtk->vObjFans).pArray[lVar6];
      if (((long)iVar2 < 0) || ((pNtk->vFanSto).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      if ((pNtk->vObjType).nSize <= iVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      iVar5 = (pNtk->vFanSto).pArray[iVar2];
      switch((pNtk->vObjType).pArray[lVar6]) {
      case '\x04':
      case '\v':
        nGates[2] = nGates[2] + 1;
        break;
      default:
        if (iVar5 < 2) {
          __assert_fail("nFan >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                        ,0x127,"int Acb_NtkCollectMfsGates(char *, Vec_Ptr_t *, Vec_Ptr_t *, int *)"
                       );
        }
        nGates[4] = nGates[4] + iVar5 + -1;
        break;
      case '\a':
        *nGates = *nGates + 1;
        break;
      case '\b':
        nGates[1] = nGates[1] + 1;
        break;
      case '\f':
        nGates[3] = nGates[3] + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  Acb_ManFree(pNtk->pDesign);
  return uVar1;
}

Assistant:

int Acb_NtkCollectMfsGates( char * pFileName, Vec_Ptr_t * vNamesRefed, Vec_Ptr_t * vNamesDerefed, int nGates[5] )
{
    Acb_Ntk_t * pNtkF        = Acb_VerilogSimpleRead( pFileName, NULL );
    Vec_Int_t * vNamesInv    = Vec_IntInvert( &pNtkF->vObjName, 0 ) ;
    Vec_Int_t * vObjsRefed   = Acb_NamesToIds( pNtkF, vNamesInv, vNamesRefed );
    Vec_Int_t * vObjsDerefed = Acb_NamesToIds( pNtkF, vNamesInv, vNamesDerefed );
    Vec_Int_t * vNodes       = Acb_NtkCollectMffc( pNtkF, vObjsRefed, vObjsDerefed );
    int i, iObj, RetValue    = Vec_IntSize(vNodes);
    Vec_IntFree( vNamesInv );
    Vec_IntFree( vObjsRefed );
    Vec_IntFree( vObjsDerefed );
    for ( i = 0; i < 5; i++ )
        nGates[i] = 0;
    Vec_IntForEachEntry( vNodes, iObj, i )
    {
        int nFan = Acb_ObjFaninNum(pNtkF, iObj);
        int Type = Acb_ObjType( pNtkF, iObj );
        if ( Type == ABC_OPER_CONST_F ) 
            nGates[0]++;
        else if ( Type == ABC_OPER_CONST_T ) 
            nGates[1]++;
        else if ( Type == ABC_OPER_BIT_BUF || Type == ABC_OPER_CO ) 
            nGates[2]++;
        else if ( Type == ABC_OPER_BIT_INV ) 
            nGates[3]++;
        else
        {
            assert( nFan >= 2 );
            nGates[4] += Acb_ObjFaninNum(pNtkF, iObj)-1;
        }
    }
    Vec_IntFree( vNodes );
    Acb_ManFree( pNtkF->pDesign );
    return RetValue;
}